

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_GMAA_MAAstarCluster.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  QBG *this;
  PlanningUnitMADPDiscreteParameters params;
  GMAA_MAAstarCluster local_6f0 [824];
  undefined1 local_3b8 [40];
  double local_390;
  QBG *local_2b8;
  ProblemDecTiger pdt;
  
  ProblemDecTiger::ProblemDecTiger(&pdt);
  poVar1 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"------gmaa MAA* QBG  -horizon=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"-------");
  std::endl<char,std::char_traits<char>>(poVar1);
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(&params);
  PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(&params,0));
  GMAA_MAAstarCluster::GMAA_MAAstarCluster
            (local_6f0,(BGIP_SolverCreatorInterface *)0x0,4,
             (DecPOMDPDiscreteInterface *)
             (&pdt.super_DecPOMDPDiscrete + *(long *)(pdt._0_8_ + -0x50)),&params,0);
  GeneralizedMAAStarPlanner::SetVerbose((int)local_3b8);
  this = (QBG *)operator_new(0x60);
  QBG::QBG(this,(PlanningUnitDecPOMDPDiscrete *)local_6f0);
  (**(code **)(*(long *)(this + *(long *)(*(long *)this + -0x60)) + 0x10))
            (this + *(long *)(*(long *)this + -0x60));
  poVar1 = std::operator<<((ostream *)&std::cout,"heuristic computed.");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_2b8 = this;
  GeneralizedMAAStarPlanner::Plan();
  std::operator<<((ostream *)&std::cout,"\noptimal value=");
  std::ostream::_M_insert<double>(local_390);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  (**(code **)(*(long *)this + 8))(this);
  poVar1 = std::operator<<((ostream *)&std::cout,"nr of BG jpols evaluated=");
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Max nr of jpols in Pool=");
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  TimedAlgorithm::PrintTimersSummary();
  GMAA_MAAstarCluster::~GMAA_MAAstarCluster(local_6f0);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(&params);
  poVar1 = std::operator<<((ostream *)&std::cout,"\n\nTotal ticks ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," clock ticks = ");
  poVar1 = std::ostream::_M_insert<double>(0.0);
  poVar1 = std::operator<<(poVar1,"s");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Total utime = ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," clock ticks = ");
  poVar1 = std::ostream::_M_insert<double>(0.0);
  poVar1 = std::operator<<(poVar1,"s");
  std::endl<char,std::char_traits<char>>(poVar1);
  ProblemDecTiger::~ProblemDecTiger(&pdt);
  return 0;
}

Assistant:

int main()
{    
    ProblemDecTiger pdt;

//    for(size_t h = 4; h <= 4; h++)
    for(size_t h = 4; h <= 4; h++)
    {

        cout << "---------------------------------------"<<endl;
        cout << "------gmaa MAA* QBG  -horizon="<<h<<"-------"<<endl;
        TestGMAA_MAAstar(h, pdt, eQBG);        
        //cout << "---------------------------------------"<<endl;
        //cout << "------gmaa MAA* QPOMDP  -horizon="<<h<<"----"<<endl;
        //TestGMAA_MAAstar(h, pdt, eQPOMDP);
        //cout << "---------------------------------------"<<endl;
        //cout << "------gmaa MAA* QMDP  -horizon="<<h<<"------"<<endl;
        //TestGMAA_MAAstar(h, pdt, eQMDP);
    }
    
    cout << "\n\nTotal ticks "<< tot_ticks << " clock ticks = " << 
        (double)(tot_ticks) / cps <<"s" << endl <<
        "Total utime = "<< tot_utime << " clock ticks = "<< 
        (double (tot_utime))/ cps << "s" << endl;
}